

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::object::write_compact<std::ostream,pstore::dump::object_char_traits>
          (object *this,basic_ostream<char,_std::char_traits<char>_> *os,
          object_strings<pstore::dump::object_char_traits> *strings)

{
  pointer pmVar1;
  element_type *peVar2;
  object_strings<pstore::dump::object_char_traits> *poVar3;
  pointer p;
  undefined4 local_44;
  value local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(strings->openbrace_str)._M_dataplus._M_p,(strings->openbrace_str)._M_string_length)
  ;
  p = (this->members_).
      super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (this->members_).
           super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p != pmVar1) {
    poVar3 = strings;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(poVar3->space_str)._M_dataplus._M_p,(poVar3->space_str)._M_string_length);
      property((object *)&local_40,&p->property);
      local_44 = 0;
      (**(code **)(*local_40._vptr_value + 0xa8))(local_40._vptr_value,os,&local_44);
      if (local_38 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(strings->colon_space_str)._M_dataplus._M_p,
                 (strings->colon_space_str)._M_string_length);
      peVar2 = (p->val).super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar2->_vptr_value[0x13])(peVar2,os);
      p = p + 1;
      poVar3 = (object_strings<pstore::dump::object_char_traits> *)&strings->comma_space_str;
    } while (p != pmVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(strings->space_closebrace_str)._M_dataplus._M_p,
             (strings->space_closebrace_str)._M_string_length);
  return os;
}

Assistant:

OStream &
        object::write_compact (OStream & os,
                               object_strings<ObjectCharacterTraits> const & strings) const {
            os << strings.openbrace_str;
            auto const * separator = &strings.space_str;
            for (object::member const & kvp : members_) {
                os << *separator;
                object::property (kvp.property)->write (os);
                os << strings.colon_space_str;
                kvp.val->write (os);
                separator = &strings.comma_space_str;
            }
            os << strings.space_closebrace_str;
            return os;
        }